

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

PSymbol * __thiscall
PSymbolTable::FindSymbolInTable(PSymbolTable *this,FName *symname,PSymbolTable **symtable)

{
  PSymbol **ppPVar1;
  PSymbol *pPVar2;
  FName local_20;
  FName local_1c;
  
  local_1c = (FName)symname->Index;
  ppPVar1 = TMap<FName,_PSymbol_*,_THashTraits<FName>,_TValueTraits<PSymbol_*>_>::CheckKey
                      (&this->Symbols,&local_1c);
  if (ppPVar1 == (PSymbol **)0x0) {
    if (this->ParentSymbolTable == (PSymbolTable *)0x0) {
      *symtable = (PSymbolTable *)0x0;
      pPVar2 = (PSymbol *)0x0;
    }
    else {
      local_20 = (FName)symname->Index;
      pPVar2 = FindSymbolInTable(this->ParentSymbolTable,&local_20,symtable);
    }
  }
  else {
    *symtable = this;
    pPVar2 = *ppPVar1;
  }
  return pPVar2;
}

Assistant:

PSymbol *PSymbolTable::FindSymbolInTable(FName symname, PSymbolTable *&symtable)
{
	PSymbol * const *value = Symbols.CheckKey(symname);
	if (value == NULL)
	{
		if (ParentSymbolTable != NULL)
		{
			return ParentSymbolTable->FindSymbolInTable(symname, symtable);
		}
		symtable = NULL;
		return NULL;
	}
	symtable = this;
	return *value;
}